

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_xattr_platform.c
# Opt level: O0

void test_xattr_platform(void)

{
  size_t v1;
  char *entry;
  wchar_t wVar1;
  int iVar2;
  size_t sVar3;
  char *writeval;
  char *readval;
  char *attrname;
  int r;
  int e;
  size_t insize;
  size_t size;
  void *rvalue;
  void *value;
  char *name;
  archive_entry *ae;
  archive *a;
  
  assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                      ,L',',"readtest",L'Ƥ',L'\xffffffff',"a");
  sVar3 = strlen("readval");
  wVar1 = setXattr("readtest","user.libarchive.test","readval",sVar3 + 1);
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                   ,L'/');
    test_skipping("Extended attributes are not supported on this filesystem");
  }
  else {
    ae = (archive_entry *)archive_read_disk_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                     ,L'5',(uint)(ae != (archive_entry *)0x0),
                     "NULL != (a = archive_read_disk_new())",(void *)0x0);
    name = (char *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                     ,L'7',(uint)((archive_entry *)name != (archive_entry *)0x0),"ae != NULL",
                     (void *)0x0);
    archive_entry_set_pathname((archive_entry *)name,"readtest");
    iVar2 = archive_read_disk_entry_from_file
                      ((archive *)ae,(archive_entry *)name,-1,(stat_conflict *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                        ,L':',0,"ARCHIVE_OK",(long)iVar2,
                        "archive_read_disk_entry_from_file(a, ae, -1, NULL)",(void *)0x0);
    wVar1 = archive_entry_xattr_reset((archive_entry *)name);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                     ,L'<',(uint)(L'\0' < wVar1),"e > 0",(void *)0x0);
    attrname._0_4_ = 0;
    do {
      wVar1 = archive_entry_xattr_next((archive_entry *)name,(char **)&value,&rvalue,&insize);
      if (wVar1 != L'\0') goto LAB_00263a64;
    } while ((((value == (void *)0x0) || (rvalue == (void *)0x0)) || (insize == 0)) ||
            (iVar2 = strcmp((char *)value,"user.libarchive.test"), iVar2 != 0));
    failure("Attribute value does not match");
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
               ,L'D',(char *)rvalue,"(const char *)value","readval","readval",(void *)0x0,L'\0');
    attrname._0_4_ = 1;
LAB_00263a64:
    failure("Attribute not found: %s","user.libarchive.test");
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                        ,L'J',(long)(int)attrname,"r",1,"1",(void *)0x0);
    archive_entry_free((archive_entry *)name);
    iVar2 = archive_read_free((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                        ,L'M',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
    ae = (archive_entry *)archive_write_disk_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                     ,L'O',(uint)(ae != (archive_entry *)0x0),
                     "NULL != (a = archive_write_disk_new())",(void *)0x0);
    archive_write_disk_set_options((archive *)ae,L'\x86');
    name = (char *)archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                     ,L'U',(uint)((archive_entry *)name != (archive_entry *)0x0),"ae != NULL",
                     (void *)0x0);
    archive_entry_set_pathname((archive_entry *)name,"writetest");
    archive_entry_set_filetype((archive_entry *)name,0x8000);
    archive_entry_set_perm((archive_entry *)name,0x1ac);
    archive_entry_set_mtime((archive_entry *)name,0x1e240,0x1ed2);
    archive_entry_set_size((archive_entry *)name,0);
    entry = name;
    sVar3 = strlen("writeval");
    archive_entry_xattr_add_entry
              ((archive_entry *)entry,"user.libarchive.test","writeval",sVar3 + 1);
    iVar2 = archive_write_header((archive *)ae,(archive_entry *)name);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                        ,L']',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",ae);
    archive_entry_free((archive_entry *)name);
    iVar2 = archive_write_close((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                        ,L'_',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",ae);
    iVar2 = archive_write_free((archive *)ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                        ,L'`',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
    size = (size_t)getXattr("writetest","user.libarchive.test",(size_t *)&r);
    v1 = _r;
    sVar3 = strlen("writeval");
    wVar1 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                                ,L'c',v1,"insize",sVar3 + 1,"strlen(writeval) + 1",(void *)0x0);
    if (wVar1 != L'\0') {
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_xattr_platform.c"
                          ,L'd',(void *)size,"rvalue","writeval","writeval",_r,"insize",(void *)0x0)
      ;
    }
    free((void *)size);
  }
  return;
}

Assistant:

DEFINE_TEST(test_xattr_platform)
{
#if !ARCHIVE_XATTR_SUPPORT
	skipping("Extended attributes are not supported on this platform");
#else /* ARCHIVE_XATTR_SUPPORT */
	struct archive *a;
	struct archive_entry *ae;
	const char *name;
	const void *value;
	void *rvalue;
	size_t size, insize;
	int e, r;
	const char *attrname = "user.libarchive.test";
	const char *readval = "readval";
	const char *writeval = "writeval";

	assertMakeFile("readtest", 0644, "a");

	if (!setXattr("readtest", attrname, readval, strlen(readval) + 1)) {
		skipping("Extended attributes are not supported on this "
		    "filesystem");
		return;
	}

	/* Read test */
	assert(NULL != (a = archive_read_disk_new()));
	ae = archive_entry_new();
	assert(ae != NULL);
	archive_entry_set_pathname(ae, "readtest");
	assertEqualInt(ARCHIVE_OK,
		archive_read_disk_entry_from_file(a, ae, -1, NULL));
	e = archive_entry_xattr_reset(ae);
	assert(e > 0);

	r = 0;
	while (archive_entry_xattr_next(ae, &name, &value,
	    &size) == ARCHIVE_OK) {
		if (name != NULL && value != NULL && size > 0 &&
		    strcmp(name, attrname) == 0) {
			failure("Attribute value does not match");
			assertEqualString((const char *)value, readval);
			r = 1;
			break;
		}
	}
	failure("Attribute not found: %s", attrname);
	assertEqualInt(r, 1);

	archive_entry_free(ae);
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	assert(NULL != (a = archive_write_disk_new()));
	archive_write_disk_set_options(a, ARCHIVE_EXTRACT_TIME |
	    ARCHIVE_EXTRACT_PERM | ARCHIVE_EXTRACT_XATTR);

	/* Write test */
	ae = archive_entry_new();
	assert(ae != NULL);
	archive_entry_set_pathname(ae, "writetest");
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_perm(ae, 0654);
	archive_entry_set_mtime(ae, 123456, 7890);
	archive_entry_set_size(ae, 0);
	archive_entry_xattr_add_entry(ae, attrname, writeval,
	    strlen(writeval) + 1);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	rvalue = getXattr("writetest", attrname, &insize);
	if (assertEqualInt(insize, strlen(writeval) + 1) != 0)
		assertEqualMem(rvalue, writeval, insize);
	free(rvalue);
#endif
}